

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  uint map;
  uint uVar2;
  REF_DBL *pRVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  uint cell;
  char *pcVar11;
  REF_DBL RVar12;
  REF_DBL RVar13;
  REF_DBL RVar14;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double dStack_f8;
  double dStack_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  REF_BOOL possible;
  REF_INT nodes [27];
  
  pRVar1 = ref_subdiv->grid->node;
  ref_cell = ref_subdiv->grid->cell[10];
  cell = 0;
  do {
    if (ref_cell->max <= (int)cell) {
      return 0;
    }
    if (ref_cell->c2n[(long)(int)cell * (long)ref_cell->size_per] != -1) {
      map = ref_subdiv_map(ref_subdiv,ref_cell,cell);
      uVar2 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar2 != 0) {
        pcVar11 = "nodes";
        uVar10 = 0x988;
LAB_001f6842:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               uVar10,"ref_subdiv_test_impossible_marks",(ulong)uVar2,pcVar11);
        return uVar2;
      }
      if (map != 0) {
        if (map == 0x1cb) {
          pRVar3 = pRVar1->real;
          lVar4 = (long)nodes[0];
          lVar5 = (long)nodes[1];
          lVar6 = (long)nodes[2];
          lVar7 = (long)nodes[3];
          local_148 = pRVar3[lVar4 * 0xf];
          dStack_140 = pRVar3[lVar4 * 0xf + 1];
          local_138 = pRVar3[lVar4 * 0xf + 2];
          lVar4 = (long)nodes[4];
          lVar8 = (long)nodes[5];
          dStack_130 = (pRVar3[lVar5 * 0xf] + local_148) * 0.5;
          local_128 = (pRVar3[lVar5 * 0xf + 1] + dStack_140) * 0.5;
          dStack_120 = (pRVar3[lVar5 * 0xf + 2] + local_138) * 0.5;
          local_118 = (pRVar3[lVar6 * 0xf] + local_148) * 0.5;
          dStack_110 = (pRVar3[lVar6 * 0xf + 1] + dStack_140) * 0.5;
          local_108 = (pRVar3[lVar6 * 0xf + 2] + local_138) * 0.5;
          dStack_100 = pRVar3[lVar7 * 0xf];
          dStack_f8 = pRVar3[lVar7 * 0xf + 1];
          dStack_f0 = pRVar3[lVar7 * 0xf + 2];
          dStack_e8 = (pRVar3[lVar4 * 0xf] + dStack_100) * 0.5;
          local_e0 = (pRVar3[lVar4 * 0xf + 1] + dStack_f8) * 0.5;
          dStack_d8 = (pRVar3[lVar4 * 0xf + 2] + dStack_f0) * 0.5;
          local_d0 = (pRVar3[lVar8 * 0xf] + dStack_100) * 0.5;
          dStack_c8 = (dStack_f8 + pRVar3[lVar8 * 0xf + 1]) * 0.5;
          local_c0 = (dStack_f0 + pRVar3[lVar8 * 0xf + 2]) * 0.5;
          ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&possible);
          pRVar3 = pRVar1->real;
          lVar4 = (long)nodes[0];
          lVar7 = (long)nodes[1];
          lVar8 = (long)nodes[2];
          lVar9 = (long)nodes[3];
          lVar5 = (long)nodes[4];
          lVar6 = (long)nodes[5];
          dStack_130 = pRVar3[lVar7 * 0xf];
          local_128 = pRVar3[lVar7 * 0xf + 1];
          dStack_120 = pRVar3[lVar7 * 0xf + 2];
          local_148 = (pRVar3[lVar4 * 0xf] + dStack_130) * 0.5;
          dStack_140 = (pRVar3[lVar4 * 0xf + 1] + local_128) * 0.5;
          local_138 = (pRVar3[lVar4 * 0xf + 2] + dStack_120) * 0.5;
          local_118 = (pRVar3[lVar8 * 0xf] + dStack_130) * 0.5;
          dStack_110 = (pRVar3[lVar8 * 0xf + 1] + local_128) * 0.5;
          dStack_e8 = pRVar3[lVar5 * 0xf];
          local_e0 = pRVar3[lVar5 * 0xf + 1];
          dStack_d8 = pRVar3[lVar5 * 0xf + 2];
          local_108 = (dStack_120 + pRVar3[lVar8 * 0xf + 2]) * 0.5;
          dStack_100 = (dStack_e8 + pRVar3[lVar9 * 0xf]) * 0.5;
          dStack_f8 = (pRVar3[lVar9 * 0xf + 1] + local_e0) * 0.5;
          dStack_f0 = (pRVar3[lVar9 * 0xf + 2] + dStack_d8) * 0.5;
          local_d0 = (dStack_e8 + pRVar3[lVar6 * 0xf]) * 0.5;
          dStack_c8 = (local_e0 + pRVar3[lVar6 * 0xf + 1]) * 0.5;
          local_c0 = (dStack_d8 + pRVar3[lVar6 * 0xf + 2]) * 0.5;
          ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&possible);
          pRVar3 = pRVar1->real;
          lVar4 = (long)nodes[0];
          lVar5 = (long)nodes[1];
          lVar6 = (long)nodes[2];
          lVar7 = (long)nodes[3];
          lVar8 = (long)nodes[4];
          local_118 = pRVar3[lVar6 * 0xf];
          dStack_110 = pRVar3[lVar6 * 0xf + 1];
          local_108 = pRVar3[lVar6 * 0xf + 2];
          lVar6 = (long)nodes[5];
          local_148 = (local_118 + pRVar3[lVar4 * 0xf]) * 0.5;
          dStack_140 = (dStack_110 + pRVar3[lVar4 * 0xf + 1]) * 0.5;
          local_138 = (local_108 + pRVar3[lVar4 * 0xf + 2]) * 0.5;
          dStack_130 = (local_118 + pRVar3[lVar5 * 0xf]) * 0.5;
          local_128 = (dStack_110 + pRVar3[lVar5 * 0xf + 1]) * 0.5;
          dStack_120 = (local_108 + pRVar3[lVar5 * 0xf + 2]) * 0.5;
          local_d0 = pRVar3[lVar6 * 0xf];
          dStack_c8 = pRVar3[lVar6 * 0xf + 1];
          local_c0 = pRVar3[lVar6 * 0xf + 2];
          dStack_100 = (local_d0 + pRVar3[lVar7 * 0xf]) * 0.5;
          dStack_f8 = (dStack_c8 + pRVar3[lVar7 * 0xf + 1]) * 0.5;
          dStack_f0 = (local_c0 + pRVar3[lVar7 * 0xf + 2]) * 0.5;
          dStack_e8 = (local_d0 + pRVar3[lVar8 * 0xf]) * 0.5;
          local_e0 = (dStack_c8 + pRVar3[lVar8 * 0xf + 1]) * 0.5;
          dStack_d8 = (local_c0 + pRVar3[lVar8 * 0xf + 2]) * 0.5;
          ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&possible);
          pRVar3 = pRVar1->real;
          lVar4 = (long)nodes[0];
          lVar5 = (long)nodes[1];
          local_148 = (pRVar3[lVar4 * 0xf] + pRVar3[lVar5 * 0xf]) * 0.5;
          dStack_140 = (pRVar3[lVar4 * 0xf + 1] + pRVar3[lVar5 * 0xf + 1]) * 0.5;
          local_138 = (pRVar3[lVar4 * 0xf + 2] + pRVar3[lVar5 * 0xf + 2]) * 0.5;
          lVar6 = (long)nodes[2];
          dStack_130 = (pRVar3[lVar5 * 0xf] + pRVar3[lVar6 * 0xf]) * 0.5;
          local_128 = (pRVar3[lVar5 * 0xf + 1] + pRVar3[lVar6 * 0xf + 1]) * 0.5;
          dStack_120 = (pRVar3[lVar5 * 0xf + 2] + pRVar3[lVar6 * 0xf + 2]) * 0.5;
          local_118 = (pRVar3[lVar6 * 0xf] + pRVar3[lVar4 * 0xf]) * 0.5;
          dStack_110 = (pRVar3[lVar6 * 0xf + 1] + pRVar3[lVar4 * 0xf + 1]) * 0.5;
          local_108 = (pRVar3[lVar6 * 0xf + 2] + pRVar3[lVar4 * 0xf + 2]) * 0.5;
          lVar4 = (long)nodes[3];
          lVar5 = (long)nodes[4];
          dStack_100 = pRVar3[lVar4 * 0xf] + pRVar3[lVar5 * 0xf];
          dStack_f8 = pRVar3[lVar4 * 0xf + 1] + pRVar3[lVar5 * 0xf + 1];
          dStack_f0 = pRVar3[lVar4 * 0xf + 2] + pRVar3[lVar5 * 0xf + 2];
          lVar6 = (long)nodes[5];
          dStack_e8 = pRVar3[lVar5 * 0xf] + pRVar3[lVar6 * 0xf];
          pRVar3 = pRVar1->real;
          local_e0 = pRVar3[lVar5 * 0xf + 1] + pRVar3[lVar6 * 0xf + 1];
          dStack_d8 = pRVar3[lVar5 * 0xf + 2] + pRVar3[lVar6 * 0xf + 2];
          lVar4 = (long)nodes[0];
          local_d0 = pRVar3[lVar6 * 0xf] + pRVar3[lVar4 * 0xf];
          dStack_c8 = pRVar3[lVar6 * 0xf + 1] + pRVar3[lVar4 * 0xf + 1];
          local_c0 = pRVar3[lVar6 * 0xf + 2] + pRVar3[lVar4 * 0xf + 2];
LAB_001f67f9:
          dStack_c8 = dStack_c8 * 0.5;
          local_d0 = local_d0 * 0.5;
          dStack_d8 = dStack_d8 * 0.5;
          local_e0 = local_e0 * 0.5;
          dStack_e8 = dStack_e8 * 0.5;
          dStack_f0 = dStack_f0 * 0.5;
          dStack_f8 = dStack_f8 * 0.5;
          dStack_100 = dStack_100 * 0.5;
          local_c0 = local_c0 * 0.5;
        }
        else if (map == 0x41) {
          pRVar3 = pRVar1->real;
          lVar4 = (long)nodes[0];
          lVar5 = (long)nodes[1];
          lVar6 = (long)nodes[2];
          lVar7 = (long)nodes[3];
          lVar8 = (long)nodes[4];
          lVar9 = (long)nodes[5];
          local_148 = pRVar3[lVar4 * 0xf];
          dStack_140 = pRVar3[lVar4 * 0xf + 1];
          local_138 = pRVar3[lVar4 * 0xf + 2];
          local_118 = pRVar3[lVar6 * 0xf];
          dStack_110 = pRVar3[lVar6 * 0xf + 1];
          local_108 = pRVar3[lVar6 * 0xf + 2];
          dStack_130 = (pRVar3[lVar5 * 0xf] + local_148) * 0.5;
          local_128 = (pRVar3[lVar5 * 0xf + 1] + dStack_140) * 0.5;
          dStack_120 = (local_138 + pRVar3[lVar5 * 0xf + 2]) * 0.5;
          dStack_100 = pRVar3[lVar7 * 0xf];
          dStack_f8 = pRVar3[lVar7 * 0xf + 1];
          dStack_f0 = pRVar3[lVar7 * 0xf + 2];
          local_d0 = pRVar3[lVar9 * 0xf];
          dStack_c8 = pRVar3[lVar9 * 0xf + 1];
          local_c0 = pRVar3[lVar9 * 0xf + 2];
          dStack_e8 = (pRVar3[lVar8 * 0xf] + dStack_100) * 0.5;
          local_e0 = (pRVar3[lVar8 * 0xf + 1] + dStack_f8) * 0.5;
          dStack_d8 = (dStack_f0 + pRVar3[lVar8 * 0xf + 2]) * 0.5;
        }
        else {
          if (map == 0x82) {
            pRVar3 = pRVar1->real;
            lVar4 = (long)nodes[0];
            lVar5 = (long)nodes[1];
            lVar6 = (long)nodes[2];
            lVar7 = (long)nodes[3];
            lVar8 = (long)nodes[4];
            local_148 = pRVar3[lVar4 * 0xf];
            dStack_140 = pRVar3[lVar4 * 0xf + 1];
            local_138 = pRVar3[lVar4 * 0xf + 2];
            dStack_130 = pRVar3[lVar5 * 0xf];
            local_128 = pRVar3[lVar5 * 0xf + 1];
            dStack_120 = pRVar3[lVar5 * 0xf + 2];
            local_118 = pRVar3[lVar6 * 0xf] + local_148;
            dStack_110 = pRVar3[lVar6 * 0xf + 1] + dStack_140;
            local_108 = local_138 + pRVar3[lVar6 * 0xf + 2];
            RVar12 = pRVar3[lVar7 * 0xf];
            RVar13 = pRVar3[lVar7 * 0xf + 1];
            RVar14 = pRVar3[lVar7 * 0xf + 2];
            dStack_e8 = pRVar3[lVar8 * 0xf];
            local_e0 = pRVar3[lVar8 * 0xf + 1];
            dStack_d8 = pRVar3[lVar8 * 0xf + 2];
            dStack_100 = RVar12;
            dStack_f8 = RVar13;
            dStack_f0 = RVar14;
          }
          else {
            if (map != 0x108) {
              if (map != 0x34) {
                ref_subdiv_map_to_edge(map);
                printf("pri %d, map %d\n",(ulong)cell,(ulong)map);
                pcVar11 = "map not implemented yet";
                uVar2 = 6;
                uVar10 = 0x9e1;
                goto LAB_001f6842;
              }
              pRVar3 = pRVar1->real;
              lVar4 = (long)nodes[0];
              lVar5 = (long)nodes[1];
              lVar6 = (long)nodes[2];
              lVar7 = (long)nodes[3];
              lVar8 = (long)nodes[4];
              lVar9 = (long)nodes[5];
              local_148 = pRVar3[lVar4 * 0xf];
              dStack_140 = pRVar3[lVar4 * 0xf + 1];
              local_138 = pRVar3[lVar4 * 0xf + 2];
              dStack_130 = pRVar3[lVar5 * 0xf];
              local_128 = pRVar3[lVar5 * 0xf + 1];
              dStack_120 = pRVar3[lVar5 * 0xf + 2];
              local_118 = pRVar3[lVar6 * 0xf];
              dStack_110 = pRVar3[lVar6 * 0xf + 1];
              local_108 = pRVar3[lVar6 * 0xf + 2];
              dStack_100 = pRVar3[lVar7 * 0xf] + local_148;
              dStack_f8 = pRVar3[lVar7 * 0xf + 1] + dStack_140;
              local_c0 = local_108 + pRVar3[lVar9 * 0xf + 2];
              dStack_f0 = pRVar3[lVar7 * 0xf + 2] + local_138;
              dStack_e8 = pRVar3[lVar8 * 0xf] + dStack_130;
              local_e0 = pRVar3[lVar8 * 0xf + 1] + local_128;
              dStack_d8 = pRVar3[lVar8 * 0xf + 2] + dStack_120;
              local_d0 = pRVar3[lVar9 * 0xf] + local_118;
              dStack_c8 = pRVar3[lVar9 * 0xf + 1] + dStack_110;
              goto LAB_001f67f9;
            }
            pRVar3 = pRVar1->real;
            lVar4 = (long)nodes[0];
            lVar5 = (long)nodes[1];
            lVar6 = (long)nodes[2];
            lVar7 = (long)nodes[3];
            lVar8 = (long)nodes[4];
            local_148 = pRVar3[lVar4 * 0xf];
            dStack_140 = pRVar3[lVar4 * 0xf + 1];
            local_138 = pRVar3[lVar4 * 0xf + 2];
            dStack_130 = pRVar3[lVar5 * 0xf];
            local_128 = pRVar3[lVar5 * 0xf + 1];
            dStack_120 = pRVar3[lVar5 * 0xf + 2];
            local_118 = pRVar3[lVar6 * 0xf] + dStack_130;
            dStack_110 = pRVar3[lVar6 * 0xf + 1] + local_128;
            local_108 = dStack_120 + pRVar3[lVar6 * 0xf + 2];
            RVar12 = pRVar3[lVar8 * 0xf];
            RVar13 = pRVar3[lVar8 * 0xf + 1];
            RVar14 = pRVar3[lVar8 * 0xf + 2];
            dStack_100 = pRVar3[lVar7 * 0xf];
            dStack_f8 = pRVar3[lVar7 * 0xf + 1];
            dStack_f0 = pRVar3[lVar7 * 0xf + 2];
            dStack_e8 = RVar12;
            local_e0 = RVar13;
            dStack_d8 = RVar14;
          }
          lVar4 = (long)nodes[5];
          dStack_110 = dStack_110 * 0.5;
          local_118 = local_118 * 0.5;
          local_108 = local_108 * 0.5;
          local_d0 = (pRVar3[lVar4 * 0xf] + RVar12) * 0.5;
          dStack_c8 = (pRVar3[lVar4 * 0xf + 1] + RVar13) * 0.5;
          local_c0 = (RVar14 + pRVar3[lVar4 * 0xf + 2]) * 0.5;
        }
        ref_subdiv_test_pri((REF_DBL (*) [3])&local_148,&possible);
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[6][3];
  REF_INT map;
  REF_BOOL possible;
  ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 3);
        replace_xyz0_avg(xyz, 1, 4);
        replace_xyz0_avg(xyz, 2, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 3, 0);
        replace_xyz0_avg(xyz, 4, 1);
        replace_xyz0_avg(xyz, 5, 2);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 65: /* prism split edges 0, 6 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 3, 4);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 4, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 130: /* prism split edges 1, 7 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 3, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 264: /* prism split edges 3, 8 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 4, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 459: /* prism split */
        /* near edge 0-3 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 4, 3);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 1-4 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 3, 4);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 2-5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 3, 5);
        replace_xyz0_avg(xyz, 4, 5);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* center */
        fill_xyz_avg(xyz, 0, 0, 1);
        fill_xyz_avg(xyz, 1, 1, 2);
        fill_xyz_avg(xyz, 2, 2, 0);

        fill_xyz_avg(xyz, 3, 3, 4);
        fill_xyz_avg(xyz, 4, 4, 5);
        fill_xyz_avg(xyz, 5, 5, 0);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  return REF_SUCCESS;
}